

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O3

void duckdb::BitpackingCompressionState<unsigned_long,_true,_long>::BitpackingWriter::UpdateStats
               (BitpackingCompressionState<unsigned_long,_true,_long> *state,idx_t count)

{
  unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true> *this;
  atomic<unsigned_long> *paVar1;
  ulong uVar2;
  pointer pCVar3;
  ulong uVar4;
  ulong uVar5;
  
  this = &state->current_segment;
  pCVar3 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
           operator->(this);
  LOCK();
  paVar1 = &(pCVar3->super_SegmentBase<duckdb::ColumnSegment>).count;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + count;
  UNLOCK();
  if ((state->state).all_invalid == false) {
    pCVar3 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
             operator->(this);
    uVar4 = (state->state).maximum;
    uVar5 = *(ulong *)((long)&(pCVar3->stats).statistics.stats_union + 8);
    uVar2 = *(ulong *)((long)&(pCVar3->stats).statistics.stats_union + 0x18);
    if (uVar4 <= uVar5) {
      uVar5 = uVar4;
    }
    *(ulong *)((long)&(pCVar3->stats).statistics.stats_union + 8) = uVar5;
    if (uVar4 < uVar2) {
      uVar4 = uVar2;
    }
    *(ulong *)((long)&(pCVar3->stats).statistics.stats_union + 0x18) = uVar4;
    pCVar3 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
             operator->(this);
    uVar4 = (state->state).minimum;
    uVar5 = *(ulong *)((long)&(pCVar3->stats).statistics.stats_union + 8);
    uVar2 = *(ulong *)((long)&(pCVar3->stats).statistics.stats_union + 0x18);
    if (uVar4 <= uVar5) {
      uVar5 = uVar4;
    }
    *(ulong *)((long)&(pCVar3->stats).statistics.stats_union + 8) = uVar5;
    if (uVar4 < uVar2) {
      uVar4 = uVar2;
    }
    *(ulong *)((long)&(pCVar3->stats).statistics.stats_union + 0x18) = uVar4;
  }
  return;
}

Assistant:

static void UpdateStats(BitpackingCompressionState<T, WRITE_STATISTICS> *state, idx_t count) {
			state->current_segment->count += count;

			if (WRITE_STATISTICS && !state->state.all_invalid) {
				state->current_segment->stats.statistics.template UpdateNumericStats<T>(state->state.maximum);
				state->current_segment->stats.statistics.template UpdateNumericStats<T>(state->state.minimum);
			}
		}